

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsGetEntityTypeFromName(char *name,FmsEntityType *ent_type)

{
  int iVar1;
  FmsEntityType FVar2;
  
  if (name == (char *)0x0) {
    return 1;
  }
  if (ent_type == (FmsEntityType *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = strcmp("FMS_VERTEX",name);
    FVar2 = FMS_VERTEX;
    if (iVar1 != 0) {
      iVar1 = strcmp("FMS_EDGE",name);
      if (iVar1 == 0) {
        FVar2 = FMS_EDGE;
      }
      else {
        iVar1 = strcmp("FMS_TRIANGLE",name);
        if (iVar1 == 0) {
          FVar2 = FMS_TRIANGLE;
        }
        else {
          iVar1 = strcmp("FMS_QUADRILATERAL",name);
          if (iVar1 == 0) {
            FVar2 = FMS_QUADRILATERAL;
          }
          else {
            iVar1 = strcmp("FMS_TETRAHEDRON",name);
            if (iVar1 == 0) {
              FVar2 = FMS_TETRAHEDRON;
            }
            else {
              iVar1 = strcmp("FMS_HEXAHEDRON",name);
              if (iVar1 == 0) {
                FVar2 = FMS_HEXAHEDRON;
              }
              else {
                iVar1 = strcmp("FMS_WEDGE",name);
                if (iVar1 == 0) {
                  FVar2 = FMS_WEDGE;
                }
                else {
                  iVar1 = strcmp("FMS_PYRAMID",name);
                  if (iVar1 != 0) {
                    return 3;
                  }
                  FVar2 = FMS_PYRAMID;
                }
              }
            }
          }
        }
      }
    }
    *ent_type = FVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int FmsGetEntityTypeFromName(const char * const name, FmsEntityType *ent_type) {
  if(!name) E_RETURN(1);
  if(!ent_type) E_RETURN(2);

  if(strcmp(FmsEntityTypeNames[FMS_VERTEX], name) == 0)
    *ent_type = FMS_VERTEX;
  else if(strcmp(FmsEntityTypeNames[FMS_EDGE], name) == 0)
    *ent_type = FMS_EDGE;
  else if(strcmp(FmsEntityTypeNames[FMS_TRIANGLE], name) == 0)
    *ent_type = FMS_TRIANGLE;
  else if(strcmp(FmsEntityTypeNames[FMS_QUADRILATERAL], name) == 0)
    *ent_type = FMS_QUADRILATERAL;
  else if(strcmp(FmsEntityTypeNames[FMS_TETRAHEDRON], name) == 0)
    *ent_type = FMS_TETRAHEDRON;
  else if(strcmp(FmsEntityTypeNames[FMS_HEXAHEDRON], name) == 0)
    *ent_type = FMS_HEXAHEDRON;
  else if(strcmp(FmsEntityTypeNames[FMS_WEDGE], name) == 0)
    *ent_type = FMS_WEDGE;
  else if(strcmp(FmsEntityTypeNames[FMS_PYRAMID], name) == 0)
    *ent_type = FMS_PYRAMID;
  else
    E_RETURN(3);

  return 0;
}